

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_encodedframe_overshoot_cbr(AV1_COMP *cpi,int *q)

{
  int iVar1;
  AV1_PRIMARY *pAVar2;
  LAYER_CONTEXT *pLVar3;
  _Bool _Var4;
  uint is_screen_content_type;
  int iVar5;
  int iVar6;
  int *in_RSI;
  AV1_COMP *in_RDI;
  double dVar7;
  PRIMARY_RATE_CONTROL *lp_rc;
  RATE_CONTROL *lrc;
  LAYER_CONTEXT *lc;
  int layer;
  int sl;
  int tl;
  SVC *svc;
  uint64_t sad_thr;
  int is_screen_content;
  int inter_layer_pred_on;
  int enumerator;
  double q2;
  int target_bits_per_mb;
  double new_correction_factor;
  int target_size;
  double rate_correction_factor;
  PRIMARY_RATE_CONTROL *p_rc;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  uint uVar8;
  int local_6c;
  uint local_50;
  double local_28;
  
  pAVar2 = in_RDI->ppi;
  local_28 = (in_RDI->ppi->p_rc).rate_correction_factors[0];
  iVar6 = (in_RDI->rc).avg_frame_bandwidth;
  local_50 = 0;
  is_screen_content_type = (uint)((in_RDI->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN);
  in_RDI->cyclic_refresh->counter_encode_maxq_scene_change = 0;
  if ((in_RDI->svc).spatial_layer_id < 1) goto LAB_002ccdaf;
  if ((in_RDI->ref_frame_flags & 1U) == 0) {
LAB_002ccd27:
    if ((in_RDI->ref_frame_flags & 8U) != 0) {
      _Var4 = av1_check_ref_is_low_spatial_res_super_frame(in_RDI,4);
      in_stack_ffffffffffffff6c = CONCAT13(1,(int3)in_stack_ffffffffffffff6c);
      if (_Var4) goto LAB_002ccda2;
    }
    uVar8 = in_stack_ffffffffffffff6c & 0xffff;
    if ((in_RDI->ref_frame_flags & 0x40U) != 0) {
      _Var4 = av1_check_ref_is_low_spatial_res_super_frame(in_RDI,7);
      uVar8 = (uint)CONCAT12(_Var4,(short)uVar8);
    }
    in_stack_ffffffffffffff6c = CONCAT13((char)(uVar8 >> 0x10),(int3)uVar8);
  }
  else {
    _Var4 = av1_check_ref_is_low_spatial_res_super_frame(in_RDI,1);
    in_stack_ffffffffffffff6c = CONCAT13(1,(int3)in_stack_ffffffffffffff6c);
    if (!_Var4) goto LAB_002ccd27;
  }
LAB_002ccda2:
  local_50 = in_stack_ffffffffffffff6c >> 0x18;
LAB_002ccdaf:
  if (((in_RDI->svc).spatial_layer_id < 1) || (local_50 == 0)) {
    if ((in_RDI->sf).rt_sf.rc_compute_spatial_var_sc == 0) {
      if ((((in_RDI->common).width * (in_RDI->common).height < 0xe1000) ||
          ((pAVar2->p_rc).buffer_level <= (pAVar2->p_rc).optimal_buffer_level >> 1)) ||
         (0x1ffff < (in_RDI->rc).avg_source_sad)) {
        *in_RSI = (in_RDI->rc).worst_quality * 3 + *in_RSI >> 2;
      }
      else {
        *in_RSI = *in_RSI + (in_RDI->rc).worst_quality >> 1;
      }
      if (is_screen_content_type != 0) {
        *in_RSI = (in_RDI->rc).worst_quality;
      }
    }
    else if ((in_RDI->rc).frame_spatial_variance < 100) {
      *in_RSI = (in_RDI->rc).worst_quality + *in_RSI >> 1;
    }
    else if (((in_RDI->rc).frame_spatial_variance < 400) ||
            (((in_RDI->rc).frame_source_sad < 80000 && ((in_RDI->rc).frame_spatial_variance < 1000))
            )) {
      *in_RSI = (in_RDI->rc).worst_quality * 3 + *in_RSI >> 2;
    }
    else {
      *in_RSI = (in_RDI->rc).worst_quality;
    }
  }
  else {
    *in_RSI = (in_RDI->rc).worst_quality + *in_RSI >> 1;
  }
  (pAVar2->p_rc).avg_frame_qindex[1] = *in_RSI;
  (pAVar2->p_rc).buffer_level = (pAVar2->p_rc).optimal_buffer_level;
  (pAVar2->p_rc).bits_off_target = (pAVar2->p_rc).optimal_buffer_level;
  (in_RDI->rc).rc_1_frame = 0;
  (in_RDI->rc).rc_2_frame = 0;
  iVar1 = (in_RDI->common).mi_params.MBs;
  dVar7 = av1_convert_qindex_to_q(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  iVar5 = get_bpmb_enumerator('\0',is_screen_content_type);
  dVar7 = ((double)(int)((ulong)((long)iVar6 << 9) / (ulong)(long)iVar1) * dVar7) / (double)iVar5;
  if (local_28 < dVar7) {
    local_28 = (dVar7 + local_28) / 2.0;
    if (50.0 < local_28) {
      local_28 = 50.0;
    }
    (in_RDI->ppi->p_rc).rate_correction_factors[0] = local_28;
  }
  if ((1 < (in_RDI->svc).number_temporal_layers) &&
     (((in_RDI->svc).spatial_layer_id == 0 || (local_50 == 0)))) {
    for (local_6c = 0; local_6c < (in_RDI->svc).number_temporal_layers; local_6c = local_6c + 1) {
      iVar6 = (in_RDI->svc).spatial_layer_id * (in_RDI->svc).number_temporal_layers + local_6c;
      pLVar3 = (in_RDI->svc).layer_context;
      pLVar3[iVar6].p_rc.avg_frame_qindex[1] = *in_RSI;
      pLVar3[iVar6].p_rc.buffer_level = pLVar3[iVar6].p_rc.optimal_buffer_level;
      pLVar3[iVar6].p_rc.bits_off_target = pLVar3[iVar6].p_rc.optimal_buffer_level;
      pLVar3[iVar6].rc.rc_1_frame = 0;
      pLVar3[iVar6].rc.rc_2_frame = 0;
      pLVar3[iVar6].p_rc.rate_correction_factors[0] = local_28;
    }
  }
  return 1;
}

Assistant:

int av1_encodedframe_overshoot_cbr(AV1_COMP *cpi, int *q) {
  AV1_COMMON *const cm = &cpi->common;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  double rate_correction_factor =
      cpi->ppi->p_rc.rate_correction_factors[INTER_NORMAL];
  const int target_size = cpi->rc.avg_frame_bandwidth;
  double new_correction_factor;
  int target_bits_per_mb;
  double q2;
  int enumerator;
  int inter_layer_pred_on = 0;
  int is_screen_content = (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN);
  cpi->cyclic_refresh->counter_encode_maxq_scene_change = 0;
  if (cpi->svc.spatial_layer_id > 0) {
    // For spatial layers: check if inter-layer (spatial) prediction is used
    // (check if any reference is being used that is the lower spatial layer),
    inter_layer_pred_on = CHECK_INTER_LAYER_PRED(LAST_FRAME) ||
                          CHECK_INTER_LAYER_PRED(GOLDEN_FRAME) ||
                          CHECK_INTER_LAYER_PRED(ALTREF_FRAME);
  }
  // If inter-layer prediction is on: we expect to pull up the quality from
  // the lower spatial layer, so we can use a lower q.
  if (cpi->svc.spatial_layer_id > 0 && inter_layer_pred_on) {
    *q = (cpi->rc.worst_quality + *q) >> 1;
  } else {
    // For easy scene changes used lower QP, otherwise set max-q.
    // If rt_sf->compute_spatial_var_sc is enabled relax the max-q
    // condition based on frame spatial variance.
    if (cpi->sf.rt_sf.rc_compute_spatial_var_sc) {
      if (cpi->rc.frame_spatial_variance < 100) {
        *q = (cpi->rc.worst_quality + *q) >> 1;
      } else if (cpi->rc.frame_spatial_variance < 400 ||
                 (cpi->rc.frame_source_sad < 80000 &&
                  cpi->rc.frame_spatial_variance < 1000)) {
        *q = (3 * cpi->rc.worst_quality + *q) >> 2;
      } else {
        *q = cpi->rc.worst_quality;
      }
    } else {
      // Set a larger QP.
      const uint64_t sad_thr = 64 * 64 * 32;
      if (cm->width * cm->height >= 1280 * 720 &&
          (p_rc->buffer_level > (p_rc->optimal_buffer_level) >> 1) &&
          cpi->rc.avg_source_sad < sad_thr) {
        *q = (*q + cpi->rc.worst_quality) >> 1;
      } else {
        *q = (3 * cpi->rc.worst_quality + *q) >> 2;
      }
      // If we arrive here for screen content: use the max-q set by the user.
      if (is_screen_content) *q = cpi->rc.worst_quality;
    }
  }
  // Adjust avg_frame_qindex, buffer_level, and rate correction factors, as
  // these parameters will affect QP selection for subsequent frames. If they
  // have settled down to a very different (low QP) state, then not adjusting
  // them may cause next frame to select low QP and overshoot again.
  p_rc->avg_frame_qindex[INTER_FRAME] = *q;
  p_rc->buffer_level = p_rc->optimal_buffer_level;
  p_rc->bits_off_target = p_rc->optimal_buffer_level;
  // Reset rate under/over-shoot flags.
  cpi->rc.rc_1_frame = 0;
  cpi->rc.rc_2_frame = 0;
  // Adjust rate correction factor.
  target_bits_per_mb =
      (int)(((uint64_t)target_size << BPER_MB_NORMBITS) / cm->mi_params.MBs);
  // Reset rate correction factor: for now base it on target_bits_per_mb
  // and qp (==max_QP). This comes from the inverse computation of
  // av1_rc_bits_per_mb().
  q2 = av1_convert_qindex_to_q(*q, cm->seq_params->bit_depth);
  enumerator = get_bpmb_enumerator(INTER_NORMAL, is_screen_content);
  new_correction_factor = (double)target_bits_per_mb * q2 / enumerator;
  if (new_correction_factor > rate_correction_factor) {
    rate_correction_factor =
        (new_correction_factor + rate_correction_factor) / 2.0;
    if (rate_correction_factor > MAX_BPB_FACTOR)
      rate_correction_factor = MAX_BPB_FACTOR;
    cpi->ppi->p_rc.rate_correction_factors[INTER_NORMAL] =
        rate_correction_factor;
  }
  // For temporal layers: reset the rate control parameters across all
  // temporal layers. Only do it for spatial enhancement layers when
  // inter_layer_pred_on is not set (off).
  if (cpi->svc.number_temporal_layers > 1 &&
      (cpi->svc.spatial_layer_id == 0 || inter_layer_pred_on == 0)) {
    SVC *svc = &cpi->svc;
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      int sl = svc->spatial_layer_id;
      const int layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *lc = &svc->layer_context[layer];
      RATE_CONTROL *lrc = &lc->rc;
      PRIMARY_RATE_CONTROL *lp_rc = &lc->p_rc;
      lp_rc->avg_frame_qindex[INTER_FRAME] = *q;
      lp_rc->buffer_level = lp_rc->optimal_buffer_level;
      lp_rc->bits_off_target = lp_rc->optimal_buffer_level;
      lrc->rc_1_frame = 0;
      lrc->rc_2_frame = 0;
      lp_rc->rate_correction_factors[INTER_NORMAL] = rate_correction_factor;
    }
  }
  return 1;
}